

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_future.cpp
# Opt level: O0

void __thiscall Omega_h::Future<double>::Future(Future<double> *this,Read<double> *buf)

{
  anon_class_16_1_ba1d39d3 local_b8;
  callback_type local_a8;
  vector<int,_std::allocator<int>_> local_88;
  Write<double> local_60;
  undefined1 local_50 [24];
  Read<double> *buf_local;
  Future<double> *this_local;
  undefined8 local_28;
  Write<double> *local_20;
  Write<double> *local_18;
  Future<double> *local_10;
  
  this_local = (Future<double> *)local_50;
  local_50._0_8_ = (Alloc *)0x0;
  local_50._8_8_ = (void *)0x0;
  local_20 = &local_60;
  local_60.shared_alloc_.alloc = (Alloc *)0x0;
  local_60.shared_alloc_.direct_ptr = (void *)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_88.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_50._16_8_ = buf;
  buf_local = &this->sendbuf_;
  local_28 = this_local;
  local_18 = local_20;
  local_10 = this_local;
  std::vector<int,_std::allocator<int>_>::vector(&local_88);
  Read<double>::Read(&local_b8.buf,buf);
  std::function<Omega_h::Read<double>(Omega_h::Write<double>)>::
  function<Omega_h::Future<double>::Future(Omega_h::Read<double>)::_lambda(Omega_h::Write<double>)_1_,void>
            ((function<Omega_h::Read<double>(Omega_h::Write<double>)> *)&local_a8,&local_b8);
  Future(this,(Read<double> *)local_50,&local_60,&local_88,&local_a8);
  std::function<Omega_h::Read<double>_(Omega_h::Write<double>)>::~function(&local_a8);
  Future(Omega_h::Read<double>)::{lambda(Omega_h::Write<double>)#1}::~Write
            ((_lambda_Omega_h__Write<double>__1_ *)&local_b8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_88);
  Write<double>::~Write(&local_60);
  Read<double>::~Read((Read<double> *)local_50);
  this->status_ = completed;
  return;
}

Assistant:

Future<T>::Future(Read<T> buf)
    : Future({} /* sendbuf */, {} /* recvbuf */, {} /* request */,
          [buf](recvbuf_type) { return buf; }) {
  status_ = Status::completed;
}